

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3Int.cpp
# Opt level: O3

uint64_t SignExtend(uint64_t value,uint32_t bits)

{
  byte bVar1;
  
  bVar1 = -(char)bits;
  return ((ulong)((long)(value << (bVar1 & 0x3f)) >> 0x3f) >> (bVar1 & 0x3f)) << (bVar1 & 0x3f) |
         value;
}

Assistant:

uint64_t SignExtend (uint64_t value, uint32_t bits)
{
    // Extract lower bits from value and signextend.
    // From detour_sign_extend.
    const uint32_t left = 64 - bits;
    const uint64_t m1 = (uint64_t)(int64_t)-1;
    const int64_t wide = (int64_t)(value << left);
    const uint64_t sign = (wide < 0) ? (m1 << left) : 0;
    return value | sign;
}